

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-room.c
# Opt level: O1

_Bool build_room_of_chambers(chunk *c,loc_conflict centre,wchar_t rating)

{
  short sVar1;
  short sVar2;
  _Bool _Var3;
  int16_t iVar4;
  uint32_t uVar5;
  uint uVar6;
  uint uVar7;
  uint32_t uVar8;
  int iVar9;
  wchar_t wVar10;
  loc lVar11;
  square *psVar12;
  loc lVar13;
  loc grid;
  loc grid_00;
  wchar_t *pwVar14;
  wchar_t wVar15;
  ulong uVar16;
  byte bVar17;
  int iVar18;
  uint uVar19;
  wchar_t wVar20;
  long lVar21;
  ulong uVar22;
  int iVar23;
  wchar_t wVar24;
  ulong uVar25;
  wchar_t y1;
  wchar_t x1;
  wchar_t wVar27;
  wchar_t y2;
  int iVar28;
  wchar_t wVar29;
  wchar_t wVar30;
  char *name_00;
  ulong uVar31;
  bool bVar32;
  char name [40];
  ulong local_f8;
  loc_conflict local_a8;
  int local_9c;
  ulong local_98;
  ulong local_90;
  uint local_88;
  wchar_t local_84;
  int local_80;
  int local_7c;
  uint local_78;
  uint32_t local_74;
  wchar_t local_70;
  wchar_t local_6c;
  ulong local_68;
  ulong local_60;
  char local_58 [40];
  ulong uVar26;
  
  local_a8 = centre;
  local_6c = Rand_div(0x2d);
  local_70 = c->depth;
  iVar4 = m_bonus(0x14,local_70);
  iVar18 = (int)iVar4;
  wVar27 = iVar18 + L'\x14';
  uVar5 = Rand_div(0x14);
  iVar4 = m_bonus(0x14,c->depth);
  wVar29 = uVar5 + (int)iVar4 + L'\x15';
  event_signal_size(EVENT_GEN_ROOM_CHOOSE_SIZE,wVar27,wVar29);
  if (((local_a8.y < c->height) && (local_a8.x < c->width)) ||
     (_Var3 = find_space(&local_a8,wVar27,wVar29), _Var3)) {
    iVar23 = local_a8.x;
    iVar28 = local_a8.y;
    y1 = local_a8.y - wVar27 / 2;
    uVar31 = (ulong)(uint)y1;
    local_9c = wVar29 / 2;
    x1 = local_a8.x - local_9c;
    uVar26 = (ulong)(uint)x1;
    local_84 = wVar27;
    lVar11 = (loc)loc(x1,y1);
    _Var3 = square_in_bounds((chunk_conflict *)c,lVar11);
    if (_Var3) {
      y2 = iVar28 + ((iVar18 - (iVar18 + 0x13 >> 0x1f)) + 0x13 >> 1);
      iVar18 = (wVar29 - ((int)(uVar5 + (int)iVar4 + 0x14) >> 0x1f)) + -1 >> 1;
      wVar27 = iVar23 + iVar18;
      local_68 = (ulong)(uint)wVar29;
      lVar11 = (loc)loc(wVar27,y2);
      _Var3 = square_in_bounds((chunk_conflict *)c,lVar11);
      uVar19 = 0;
      if (_Var3) {
        local_9c = -local_9c;
        uVar6 = y2 - y1;
        local_88 = -uVar6;
        if (0 < (int)uVar6) {
          local_88 = uVar6;
        }
        uVar7 = wVar27 - x1;
        uVar6 = -uVar7;
        if (0 < (int)uVar7) {
          uVar6 = uVar7;
        }
        local_60 = (ulong)((uVar6 * local_88) / 0x50 + 10);
        local_7c = y2 + L'\x01';
        local_80 = wVar27 + L'\x01';
        do {
          local_78 = uVar19;
          uVar5 = Rand_div(4);
          uVar8 = Rand_div(10);
          iVar23 = uVar5 + uVar8 + 3;
          uVar8 = Rand_div(4);
          iVar28 = uVar8 + uVar5 + 3;
          uVar5 = Rand_div((local_7c - y1) - iVar28);
          wVar20 = y1 + uVar5;
          uVar8 = Rand_div((local_80 - x1) - iVar23);
          wVar15 = uVar8 + x1;
          wVar29 = iVar28 + wVar20;
          if (y2 <= wVar29) {
            wVar29 = y2;
          }
          wVar24 = iVar23 + wVar15;
          if (wVar27 <= wVar24) {
            wVar24 = wVar27;
          }
          fill_rectangle(c,uVar5 + 1 + y1,uVar8 + 1 + x1,wVar29 + L'\xffffffff',
                         wVar24 + L'\xffffffff',FEAT_MAGMA,L'\0');
          iVar23 = wVar29 - wVar20;
          if (wVar20 <= wVar29) {
            wVar30 = wVar20;
            do {
              make_inner_chamber_wall(c,wVar30,wVar15);
              make_inner_chamber_wall(c,wVar30,wVar24);
              wVar30 = wVar30 + L'\x01';
            } while (wVar29 + L'\x01' != wVar30);
          }
          iVar28 = wVar24 - wVar15;
          local_98 = (ulong)(uint)wVar24;
          if (wVar15 <= wVar24) {
            wVar30 = wVar15;
            do {
              make_inner_chamber_wall(c,wVar20,wVar30);
              make_inner_chamber_wall(c,wVar29,wVar30);
              wVar30 = wVar30 + L'\x01';
            } while (wVar24 + L'\x01' != wVar30);
          }
          iVar9 = -iVar28;
          if (0 < iVar28) {
            iVar9 = iVar28;
          }
          local_90 = CONCAT44(local_90._4_4_,iVar9 + 1);
          iVar28 = -iVar23;
          if (0 < iVar23) {
            iVar28 = iVar23;
          }
          local_74 = iVar28 + 1;
          iVar23 = 0;
          do {
            uVar5 = Rand_div(2);
            uVar8 = Rand_div(2);
            if (uVar5 == 0) {
              wVar24 = (wchar_t)local_98;
              if (uVar8 == 0) {
                wVar24 = wVar15;
              }
              uVar5 = Rand_div(local_74);
              wVar30 = uVar5 + wVar20;
            }
            else {
              wVar30 = wVar29;
              if (uVar8 == 0) {
                wVar30 = wVar20;
              }
              uVar5 = Rand_div((uint32_t)local_90);
              wVar24 = uVar5 + wVar15;
            }
            lVar11 = (loc)loc(wVar24,wVar30);
            _Var3 = square_iswall_inner((chunk_conflict *)c,lVar11);
            if (_Var3) {
              lVar11 = (loc)loc(wVar24,wVar30);
              _Var3 = square_in_bounds_fully((chunk_conflict *)c,lVar11);
              if (_Var3) {
                lVar21 = 0;
                iVar28 = 0;
                do {
                  sVar1 = ddy_ddd[lVar21];
                  sVar2 = ddx_ddd[lVar21];
                  lVar11 = (loc)loc(sVar2 + wVar24,sVar1 + wVar30);
                  psVar12 = square((chunk_conflict *)c,lVar11);
                  iVar9 = 0xb;
                  if (FEAT_OPEN != (uint)psVar12->feat) {
                    lVar11 = (loc)loc(sVar2 + wVar24,sVar1 + wVar30);
                    _Var3 = square_iswall_inner((chunk_conflict *)c,lVar11);
                    iVar28 = iVar28 + (uint)_Var3;
                    if ((iVar28 < 4) && (iVar9 = 0, lVar21 == 8)) {
                      lVar11 = (loc)loc(wVar24,wVar30);
                      square_set_feat((chunk_conflict *)c,lVar11,FEAT_OPEN);
                      iVar9 = 1;
                    }
                  }
                  if (iVar9 != 0) {
                    if (iVar9 != 0xb) goto LAB_001583e4;
                    break;
                  }
                  lVar21 = lVar21 + 1;
                } while (lVar21 != 9);
              }
            }
            iVar23 = iVar23 + 1;
          } while (iVar23 != 0x14);
LAB_001583e4:
          uVar19 = local_78 + 1;
        } while (uVar19 < (uint)local_60);
        local_f8 = uVar31;
        if (y1 <= y2) {
          do {
            wVar29 = (wchar_t)local_f8;
            if (x1 <= wVar27) {
              uVar16 = uVar26;
              do {
                lVar11 = (loc)(uVar16 | local_f8 << 0x20);
                _Var3 = square_in_bounds_fully((chunk_conflict *)c,lVar11);
                wVar15 = (wchar_t)uVar16;
                if (_Var3) {
                  lVar21 = 0;
                  iVar23 = 0;
                  do {
                    lVar13 = (loc)loc_sum((loc_conflict)lVar11,(loc_conflict)ddgrid_ddd[lVar21]);
                    psVar12 = square((chunk_conflict *)c,lVar13);
                    if ((FEAT_GRANITE == (uint)psVar12->feat) &&
                       (_Var3 = square_iswall_outer((chunk_conflict *)c,lVar13), !_Var3)) {
                      _Var3 = square_iswall_solid((chunk_conflict *)c,lVar13);
                      iVar23 = iVar23 + (uint)!_Var3;
                    }
                    lVar21 = lVar21 + 1;
                  } while (lVar21 != 8);
                  if (iVar23 == 5) {
                    psVar12 = square((chunk_conflict *)c,lVar11);
                    if (FEAT_MAGMA != (uint)psVar12->feat) {
LAB_00158501:
                      square_set_feat((chunk_conflict *)c,lVar11,FEAT_GRANITE);
                      generate_mark(c,wVar29,wVar15,wVar29,wVar15,L'\v');
                    }
                  }
                  else if (5 < iVar23) goto LAB_00158501;
                }
                uVar16 = (ulong)(uint)(wVar15 + L'\x01');
              } while (wVar15 != wVar27);
            }
            local_f8 = (ulong)(uint)(wVar29 + L'\x01');
          } while (wVar29 != y2);
        }
        uVar7 = local_88 >> 2;
        uVar19 = local_88 >> 1;
        iVar23 = 0x31;
        do {
          uVar5 = Rand_div(uVar6 >> 1);
          uVar8 = Rand_div(uVar19);
          lVar11 = (loc)loc(uVar5 + (uVar6 >> 2) + x1,uVar8 + uVar7 + y1);
          psVar12 = square((chunk_conflict *)c,lVar11);
          bVar32 = iVar23 != 0;
          iVar23 = iVar23 + -1;
          if (FEAT_MAGMA == (uint)psVar12->feat) break;
        } while (bVar32);
        square_set_feat((chunk_conflict *)c,lVar11,FEAT_FLOOR);
        hollow_out_room(c,(loc_conflict)lVar11);
        iVar23 = 0;
        do {
          bVar32 = true;
          if (y1 < y2) {
            bVar17 = 0;
            uVar16 = uVar31;
            do {
              if (x1 < wVar27) {
                uVar25 = uVar26;
                do {
                  lVar11 = (loc)(uVar25 | uVar16 << 0x20);
                  psVar12 = square((chunk_conflict *)c,lVar11);
                  if ((FEAT_MAGMA == (uint)psVar12->feat) &&
                     (_Var3 = square_in_bounds_fully((chunk_conflict *)c,lVar11), _Var3)) {
                    uVar22 = 0;
                    do {
                      lVar13 = ddgrid_ddd[uVar22];
                      grid = (loc)loc_sum((loc_conflict)lVar11,(loc_conflict)lVar13);
                      _Var3 = square_iswall_inner((chunk_conflict *)c,grid);
                      bVar32 = true;
                      if (_Var3) {
                        grid_00 = (loc)loc_sum((loc_conflict)grid,(loc_conflict)lVar13);
                        _Var3 = square_in_bounds((chunk_conflict *)c,grid_00);
                        if (_Var3) {
                          psVar12 = square((chunk_conflict *)c,grid_00);
                          if (FEAT_FLOOR == (uint)psVar12->feat) {
                            pwVar14 = &FEAT_BROKEN;
                            grid_00 = grid;
LAB_001586ec:
                            square_set_feat((chunk_conflict *)c,grid_00,*pwVar14);
                            square_set_feat((chunk_conflict *)c,lVar11,FEAT_FLOOR);
                            hollow_out_room(c,(loc_conflict)lVar11);
                            bVar17 = 1;
                            bVar32 = false;
                          }
                          else {
                            _Var3 = square_iswall_inner((chunk_conflict *)c,grid_00);
                            if (_Var3) {
                              lVar13 = (loc)loc_sum((loc_conflict)grid_00,(loc_conflict)lVar13);
                              _Var3 = square_in_bounds((chunk_conflict *)c,lVar13);
                              if ((_Var3) &&
                                 (psVar12 = square((chunk_conflict *)c,lVar13),
                                 FEAT_FLOOR == (uint)psVar12->feat)) {
                                square_set_feat((chunk_conflict *)c,grid,FEAT_FLOOR);
                                pwVar14 = &FEAT_FLOOR;
                                goto LAB_001586ec;
                              }
                            }
                          }
                        }
                      }
                    } while ((bVar32) && (bVar32 = uVar22 < 3, uVar22 = uVar22 + 1, bVar32));
                  }
                  wVar29 = (int)uVar25 + L'\x01';
                  uVar25 = (ulong)(uint)wVar29;
                } while (wVar29 != wVar27);
              }
              wVar29 = (int)uVar16 + L'\x01';
              uVar16 = (ulong)(uint)wVar29;
            } while (wVar29 != y2);
            bVar32 = (bool)(bVar17 ^ 1);
          }
        } while ((!bVar32) && (iVar23 = iVar23 + 1, iVar23 != 100));
        if (y1 <= y2) {
          iVar18 = iVar18 - local_9c;
          uVar16 = uVar31;
          do {
            wVar29 = (wchar_t)uVar16;
            if (x1 <= wVar27) {
              uVar25 = uVar26;
              iVar23 = iVar18 + 1;
              do {
                wVar15 = (wchar_t)uVar25;
                lVar11 = (loc)(uVar25 | uVar16 << 0x20);
                psVar12 = square((chunk_conflict *)c,lVar11);
                if (FEAT_OPEN == (uint)psVar12->feat) {
                  square_set_feat((chunk_conflict *)c,lVar11,FEAT_GRANITE);
                  generate_mark(c,wVar29,wVar15,wVar29,wVar15,L'\v');
                }
                else {
                  psVar12 = square((chunk_conflict *)c,lVar11);
                  if (FEAT_BROKEN == (uint)psVar12->feat) {
                    place_random_door((chunk_conflict *)c,(loc_conflict)lVar11);
                  }
                }
                uVar25 = (ulong)(uint)(wVar15 + L'\x01');
                iVar23 = iVar23 + -1;
              } while (iVar23 != 0);
            }
            uVar16 = (ulong)(uint)(wVar29 + L'\x01');
          } while (wVar29 != y2);
        }
        local_98 = 1;
        if (L'\x01' < y1) {
          local_98 = uVar31;
        }
        wVar15 = (wchar_t)local_98 + L'\xffffffff';
        wVar20 = y2 + L'\x02';
        wVar29 = c->height;
        if (wVar20 < c->height) {
          wVar29 = wVar20;
        }
        if ((wchar_t)local_98 <= wVar29) {
          wVar29 = L'\x01';
          if (L'\x01' < x1) {
            wVar29 = x1;
          }
          local_90 = (ulong)(uint)(wVar29 + L'\xffffffff');
          wVar30 = wVar27 + L'\x02';
          wVar24 = wVar15;
          do {
            wVar10 = c->width;
            if (wVar30 < c->width) {
              wVar10 = wVar30;
            }
            if (wVar29 <= wVar10) {
              uVar31 = local_90;
              do {
                lVar11 = (loc)((ulong)(uint)wVar24 << 0x20 | uVar31);
                _Var3 = square_iswall_inner((chunk_conflict *)c,lVar11);
                if ((_Var3) ||
                   (psVar12 = square((chunk_conflict *)c,lVar11), FEAT_MAGMA == (uint)psVar12->feat)
                   ) {
                  lVar21 = 0;
                  do {
                    lVar13 = (loc)loc_sum((loc_conflict)lVar11,(loc_conflict)ddgrid_ddd[lVar21]);
                    _Var3 = square_in_bounds((chunk_conflict *)c,lVar13);
                    if (_Var3) {
                      psVar12 = square((chunk_conflict *)c,lVar13);
                      if (FEAT_FLOOR == (uint)psVar12->feat) break;
                      if (lVar21 == 8) {
                        square_set_feat((chunk_conflict *)c,lVar11,FEAT_GRANITE);
                      }
                    }
                    lVar21 = lVar21 + 1;
                  } while (lVar21 != 9);
                }
                _Var3 = square_isfloor((chunk_conflict *)c,lVar11);
                if (_Var3) {
                  lVar21 = 0;
                  do {
                    lVar13 = (loc)loc_sum((loc_conflict)lVar11,(loc_conflict)ddgrid_ddd[lVar21]);
                    _Var3 = square_in_bounds((chunk_conflict *)c,lVar13);
                    if (_Var3) {
                      psVar12 = square((chunk_conflict *)c,lVar13);
                      flag_on_dbg(psVar12->info,3,4,"square(c, grid1)->info","SQUARE_ROOM");
                      psVar12 = square((chunk_conflict *)c,lVar13);
                      flag_on_dbg(psVar12->info,3,0x14,"square(c, grid1)->info","SQUARE_NO_STAIRS");
                      if (local_70 < local_6c) {
                        psVar12 = square((chunk_conflict *)c,lVar13);
                        flag_on_dbg(psVar12->info,3,2,"square(c, grid1)->info","SQUARE_GLOW");
                      }
                    }
                    lVar21 = lVar21 + 1;
                  } while (lVar21 != 9);
                }
                uVar31 = uVar31 + 1;
                wVar10 = c->width;
                if (wVar30 < c->width) {
                  wVar10 = wVar30;
                }
              } while ((wchar_t)uVar31 < wVar10);
            }
            wVar24 = wVar24 + L'\x01';
            wVar10 = c->height;
            if (wVar20 < c->height) {
              wVar10 = wVar20;
            }
          } while (wVar24 < wVar10);
        }
        wVar29 = c->height;
        if (wVar20 < c->height) {
          wVar29 = wVar20;
        }
        if ((wchar_t)local_98 <= wVar29) {
          wVar29 = L'\x01';
          if (L'\x01' < x1) {
            wVar29 = x1;
          }
          wVar24 = wVar27 + L'\x02';
          do {
            wVar30 = c->width;
            if (wVar24 < c->width) {
              wVar30 = wVar24;
            }
            if (wVar29 <= wVar30) {
              uVar31 = (ulong)(uint)(wVar29 + L'\xffffffff');
              do {
                lVar11 = (loc)((ulong)(uint)wVar15 << 0x20 | uVar31);
                _Var3 = square_in_bounds_fully((chunk_conflict *)c,lVar11);
                if ((_Var3) && (_Var3 = square_iswall_inner((chunk_conflict *)c,lVar11), _Var3)) {
                  lVar21 = 0;
                  do {
                    lVar13 = (loc)loc_sum((loc_conflict)lVar11,(loc_conflict)ddgrid_ddd[lVar21]);
                    psVar12 = square((chunk_conflict *)c,lVar13);
                    if ((((FEAT_GRANITE == (uint)psVar12->feat) &&
                         (_Var3 = square_iswall_inner((chunk_conflict *)c,lVar11), !_Var3)) &&
                        (_Var3 = square_iswall_outer((chunk_conflict *)c,lVar11), !_Var3)) &&
                       (_Var3 = square_iswall_solid((chunk_conflict *)c,lVar11), !_Var3)) {
                      square_set_feat((chunk_conflict *)c,lVar11,FEAT_GRANITE);
                      generate_mark(c,wVar15,(wchar_t)uVar31,wVar15,(wchar_t)uVar31,L'\f');
                      break;
                    }
                    lVar21 = lVar21 + 1;
                  } while (lVar21 != 9);
                }
                uVar31 = uVar31 + 1;
                wVar30 = c->width;
                if (wVar24 < c->width) {
                  wVar30 = wVar24;
                }
              } while ((wchar_t)uVar31 < wVar30);
            }
            wVar15 = wVar15 + L'\x01';
            wVar30 = c->height;
            if (wVar20 < c->height) {
              wVar30 = wVar20;
            }
          } while (wVar15 < wVar30);
        }
        name_00 = local_58;
        get_chamber_monsters(c,y1,x1,y2,wVar27,name_00,(int)local_68 * local_84);
        add_to_monster_rating(c,10);
        uVar19 = 1;
        if ((player->opts).opt[0x18] == true) {
          if (local_58[0] == '\0') {
            name_00 = "empty";
          }
          msg("Room of chambers (%s)",name_00);
        }
      }
      goto LAB_00158bc9;
    }
  }
  uVar19 = 0;
LAB_00158bc9:
  return SUB41(uVar19,0);
}

Assistant:

bool build_room_of_chambers(struct chunk *c, struct loc centre, int rating)
{
	int i, d;
	int area, num_chambers;
	int y1, x1, y2, x2;
	struct loc grid;
	int height, width, count;

	char name[40];

	/* Deeper in the dungeon, chambers are less likely to be lit. */
	bool light = (randint0(45) > c->depth) ? true : false;

	/* Calculate a level-dependent room size. */
	height = 20 + m_bonus(20, c->depth);
	width = 20 + randint1(20) + m_bonus(20, c->depth);

	/* Find and reserve some space in the dungeon.  Get center of room. */
	event_signal_size(EVENT_GEN_ROOM_CHOOSE_SIZE, height, width);
	if ((centre.y >= c->height) || (centre.x >= c->width)) {
		if (!find_space(&centre, height, width))
			return (false);
	}

	/* Calculate the borders of the room. */
	y1 = centre.y - (height / 2);
	x1 = centre.x - (width / 2);
	y2 = centre.y + (height - 1) / 2;
	x2 = centre.x + (width - 1) / 2;

	/* Make certain the room does not cross the dungeon edge. */
	if ((!square_in_bounds(c, loc(x1, y1))) || 
		(!square_in_bounds(c, loc(x2, y2))))
		return (false);

	/* Determine how much space we have. */
	area = ABS(y2 - y1) * ABS(x2 - x1);

	/* Calculate the number of smaller chambers to make. */
	num_chambers = 10 + area / 80;

	/* Build the chambers. */
	for (i = 0; i < num_chambers; i++) {
		int c_y1, c_x1, c_y2, c_x2;
		int size, width_local, height_local;

		/* Determine size of chamber. */
		size = 3 + randint0(4);
		width_local = size + randint0(10);
		height_local = size + randint0(4);

		/* Pick an upper-left corner at random. */
		c_y1 = y1 + randint0(1 + y2 - y1 - height_local);
		c_x1 = x1 + randint0(1 + x2 - x1 - width_local);

		/* Determine lower-right corner of chamber. */
		c_y2 = c_y1 + height_local;
		if (c_y2 > y2) c_y2 = y2;

		c_x2 = c_x1 + width_local;
		if (c_x2 > x2) c_x2 = x2;

		/* Make me a (magma filled) chamber. */
		make_chamber(c, c_y1, c_x1, c_y2, c_x2);
	}

	/* Remove useless doors, fill in tiny, narrow rooms. */
	for (grid.y = y1; grid.y <= y2; grid.y++) {
		for (grid.x = x1; grid.x <= x2; grid.x++) {
			count = 0;

			/* Stay legal. */
			if (!square_in_bounds_fully(c, grid))
				continue;

			/* Check all adjacent grids. */
			for (d = 0; d < 8; d++) {
				/* Extract adjacent location */
				struct loc grid1 = loc_sum(grid, ddgrid_ddd[d]);

				/* Count the walls and dungeon granite. */
				if ((square(c, grid1)->feat == FEAT_GRANITE) &&
					(!square_iswall_outer(c, grid1)) &&
					(!square_iswall_solid(c, grid1)))
					count++;
			}

			/* Five adjacent walls: Change non-chamber to wall. */
			if ((count == 5) && (square(c, grid)->feat != FEAT_MAGMA))
				set_marked_granite(c, grid, SQUARE_WALL_INNER);

			/* More than five adjacent walls: Change anything to wall. */
			else if (count > 5)
				set_marked_granite(c, grid, SQUARE_WALL_INNER);
		}
	}

	/* Pick a random magma spot near the center of the room. */
	for (i = 0; i < 50; i++) {
		grid = loc(x1 + ABS(x2 - x1) / 4 + randint0(ABS(x2 - x1) / 2),
				   y1 + ABS(y2 - y1) / 4 + randint0(ABS(y2 - y1) / 2));
		if (square(c, grid)->feat == FEAT_MAGMA)
			break;
	}

	/* Hollow out the first room. */
	square_set_feat(c, grid, FEAT_FLOOR);
	hollow_out_room(c, grid);

	/* Attempt to change every in-room magma grid to open floor. */
	for (i = 0; i < 100; i++) {
		/* Assume this run will do no useful work. */
		bool joy = false;

		/* Make new doors and tunnels between magma and open floor. */
		for (grid.y = y1; grid.y < y2; grid.y++) {
			for (grid.x = x1; grid.x < x2; grid.x++) {
				/* Current grid must be magma. */
				if (square(c, grid)->feat != FEAT_MAGMA) continue;

				/* Stay legal. */
				if (!square_in_bounds_fully(c, grid)) continue;

				/* Check only horizontal and vertical directions. */
				for (d = 0; d < 4; d++) {
					struct loc grid1, grid2;

					/* Extract adjacent location */
					grid1 = loc_sum(grid, ddgrid_ddd[d]);

					/* Need inner wall. */
					if (!square_iswall_inner(c, grid1)) 
						continue;

					/* Keep going in the same direction, if in bounds. */
					grid2 = loc_sum(grid1, ddgrid_ddd[d]);
					if (!square_in_bounds(c, grid2)) continue;

					/* If we find open floor, place a door. */
					if (square(c, grid2)->feat == FEAT_FLOOR) {
						joy = true;

						/* Make a broken door in the wall grid. */
						square_set_feat(c, grid1, FEAT_BROKEN);

						/* Hollow out the new room. */
						square_set_feat(c, grid, FEAT_FLOOR);
						hollow_out_room(c, grid);

						break;
					}

					/* If we find more inner wall... */
					if (square_iswall_inner(c, grid2)) {
						/* ...Keep going in the same direction. */
						struct loc grid3 = loc_sum(grid2, ddgrid_ddd[d]);
						if (!square_in_bounds(c, grid3)) continue;

						/* If we /now/ find floor, make a tunnel. */
						if (square(c, grid3)->feat == FEAT_FLOOR) {
							joy = true;

							/* Turn both wall grids into floor. */
							square_set_feat(c, grid1, FEAT_FLOOR);
							square_set_feat(c, grid2, FEAT_FLOOR);

							/* Hollow out the new room. */
							square_set_feat(c, grid, FEAT_FLOOR);
							hollow_out_room(c, grid);

							break;
						}
					}
				}
			}
		}

		/* If we could find no work to do, stop. */
		if (!joy) break;
	}


	/* Turn broken doors into a random kind of door, remove open doors. */
	for (grid.y = y1; grid.y <= y2; grid.y++) {
		for (grid.x = x1; grid.x <= x2; grid.x++) {
			if (square(c, grid)->feat == FEAT_OPEN)
				set_marked_granite(c, grid, SQUARE_WALL_INNER);
			else if (square(c, grid)->feat == FEAT_BROKEN)
				place_random_door(c, grid);
		}
	}


	/* Turn all walls and magma not adjacent to floor into dungeon granite. */
	/* Turn all floors and adjacent grids into rooms, sometimes lighting them */
	for (grid.y = (y1 - 1 > 0 ? y1 - 1 : 0);
		 grid.y < (y2 + 2 < c->height ? y2 + 2 : c->height); grid.y++) {
		for (grid.x = (x1 - 1 > 0 ? x1 - 1 : 0);
			 grid.x < (x2 + 2 < c->width ? x2 + 2 : c->width); grid.x++) {

			if (square_iswall_inner(c, grid)
				|| (square(c, grid)->feat == FEAT_MAGMA)) {
				for (d = 0; d < 9; d++) {
					/* Extract adjacent location */
					struct loc grid1 = loc_sum(grid, ddgrid_ddd[d]);

					/* Stay legal */
					if (!square_in_bounds(c, grid1)) continue;

					/* No floors allowed */
					if (square(c, grid1)->feat == FEAT_FLOOR) break;

					/* Turn me into dungeon granite. */
					if (d == 8)
						set_marked_granite(c, grid, SQUARE_NONE);
				}
			}
			if (square_isfloor(c, grid)) {
				for (d = 0; d < 9; d++) {
					/* Extract adjacent location */
					struct loc grid1 = loc_sum(grid, ddgrid_ddd[d]);

					/* Stay legal */
					if (!square_in_bounds(c, grid1)) continue;

					/* Turn into room, forbid stairs. */
					sqinfo_on(square(c, grid1)->info, SQUARE_ROOM);
					sqinfo_on(square(c, grid1)->info, SQUARE_NO_STAIRS);

					/* Illuminate if requested. */
					if (light) sqinfo_on(square(c, grid1)->info, SQUARE_GLOW);
				}
			}
		}
	}


	/* Turn all inner wall grids adjacent to dungeon granite into outer walls */
	for (grid.y = (y1 - 1 > 0 ? y1 - 1 : 0);
		 grid.y < (y2 + 2 < c->height ? y2 + 2 : c->height); grid.y++) {
		for (grid.x = (x1 - 1 > 0 ? x1 - 1 : 0);
			 grid.x < (x2 + 2 < c->width ? x2 + 2 : c->width); grid.x++) {

			/* Stay legal. */
			if (!square_in_bounds_fully(c, grid)) continue;

			if (square_iswall_inner(c, grid)) {
				for (d = 0; d < 9; d++) {
					/* Extract adjacent location */
					struct loc grid1 = loc_sum(grid, ddgrid_ddd[d]);

					/* Look for dungeon granite */
					if ((square(c, grid1)->feat == FEAT_GRANITE) && 
						(!square_iswall_inner(c, grid)) &&
						(!square_iswall_outer(c, grid)) &&
						(!square_iswall_solid(c, grid)))
					{
						/* Turn me into outer wall. */
						set_marked_granite(c, grid, SQUARE_WALL_OUTER);

						/* Done; */
						break;
					}
				}
			}
		}
	}

	/*** Now we get to place the monsters. ***/
	get_chamber_monsters(c, y1, x1, y2, x2, name, height * width);

	/* Increase the level rating */
	add_to_monster_rating(c, 10);

	/* Describe */
	ROOM_LOG("Room of chambers (%s)", strlen(name) ? name : "empty");

	/* Success. */
	return (true);
}